

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XprHelper.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>const,1,-1,true>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>const>>,3,0>
       ::
       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>const,1,_1,true>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>>
                 (redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *eval,scalar_sum_op<double,_double> *func,
                 CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                 *xpr)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  Index index;
  long lVar4;
  long lVar5;
  long lVar6;
  Scalar SVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  lVar1 = (xpr->m_rhs).
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
          .m_rows.m_value;
  lVar5 = 4;
  lVar4 = lVar1 / 4;
  pdVar2 = (eval->
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
           ).
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           .m_d.lhsImpl.
           super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>_>
           .
           super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
           .m_argImpl.
           super_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>
           .
           super_block_evaluator<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
           .
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
           .m_data;
  pdVar3 = (eval->
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
           ).
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           .m_d.rhsImpl.
           super_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
           .super_block_evaluator<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
           .
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_data;
  if (lVar1 + 1U < 3) {
    SVar7 = *pdVar2 * *pdVar3;
    for (lVar5 = 1; lVar5 < lVar1; lVar5 = lVar5 + 1) {
      SVar7 = SVar7 + pdVar2[lVar5] * pdVar3[lVar5];
    }
  }
  else {
    lVar6 = (lVar1 / 2) * 2;
    dVar10 = *pdVar3 * *pdVar2;
    dVar11 = pdVar3[1] * pdVar2[1];
    if (3 < lVar1) {
      dVar8 = pdVar3[2] * pdVar2[2];
      dVar9 = pdVar3[3] * pdVar2[3];
      for (; lVar5 < lVar4 * 4; lVar5 = lVar5 + 4) {
        dVar10 = dVar10 + pdVar3[lVar5] * pdVar2[lVar5];
        dVar11 = dVar11 + (pdVar3 + lVar5)[1] * (pdVar2 + lVar5)[1];
        dVar8 = dVar8 + pdVar3[lVar5 + 2] * pdVar2[lVar5 + 2];
        dVar9 = dVar9 + (pdVar3 + lVar5 + 2)[1] * (pdVar2 + lVar5 + 2)[1];
      }
      dVar10 = dVar10 + dVar8;
      dVar11 = dVar11 + dVar9;
      if (lVar4 * 4 < lVar6) {
        dVar10 = dVar10 + pdVar3[lVar4 * 4] * pdVar2[lVar4 * 4];
        dVar11 = dVar11 + (pdVar3 + lVar4 * 4)[1] * (pdVar2 + lVar4 * 4)[1];
      }
    }
    SVar7 = dVar11 + dVar10;
    for (; lVar6 < lVar1; lVar6 = lVar6 + 1) {
      SVar7 = SVar7 + pdVar2[lVar6] * pdVar3[lVar6];
    }
  }
  return SVar7;
}

Assistant:

explicit variable_if_dynamic(T value = 0) EIGEN_NO_THROW : m_value(value) {}